

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFragmentOpUtil.cpp
# Opt level: O1

void __thiscall
deqp::gls::FragmentOpUtil::QuadRenderer::QuadRenderer
          (QuadRenderer *this,RenderContext *context,GLSLVersion glslVersion)

{
  RenderContext *renderCtx;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ShaderProgram *pSVar4;
  TestError *this_00;
  char *__s;
  char *__s_00;
  long lVar5;
  ProgramSources sources;
  allocator<char> local_142;
  allocator<char> local_141;
  value_type local_140;
  value_type local_120;
  ProgramSources local_100;
  long lVar3;
  
  this->m_context = context;
  this->m_program = (ShaderProgram *)0x0;
  this->m_positionLoc = 0;
  this->m_colorLoc = -1;
  this->m_color1Loc = -1;
  bVar1 = glu::glslVersionIsES(glslVersion);
  this->m_blendFuncExt = !bVar1 && 6 < (int)glslVersion;
  iVar2 = (*context->_vptr_RenderContext[3])(context);
  lVar3 = CONCAT44(extraout_var,iVar2);
  if (glslVersion == GLSL_VERSION_100_ES) {
    __s_00 = 
    "attribute highp vec4 a_position;\nattribute mediump vec4 a_color;\nvarying mediump vec4 v_color;\nvoid main()\n{\n\tgl_Position = a_position;\n\tv_color = a_color;\n}\n"
    ;
  }
  else if (glslVersion == GLSL_VERSION_330) {
    __s_00 = 
    "#version 330 core\nin vec4 a_position;\nin vec4 a_color;\nin vec4 a_color1;\nout vec4 v_color;\nout vec4 v_color1;\nvoid main()\n{\n\tgl_Position\t= a_position;\n\tv_color\t\t= a_color;\n\tv_color1\t= a_color1;\n}\n"
    ;
  }
  else if (glslVersion == GLSL_VERSION_300_ES) {
    __s_00 = 
    "#version 300 es\nin highp vec4 a_position;\nin mediump vec4 a_color;\nout mediump vec4 v_color;\nvoid main()\n{\n\tgl_Position = a_position;\n\tv_color = a_color;\n}\n"
    ;
  }
  else {
    __s_00 = (char *)0x0;
  }
  if (glslVersion == GLSL_VERSION_100_ES) {
    __s = "varying mediump vec4 v_color;\nvoid main()\n{\n\tgl_FragColor = v_color;\n}\n";
  }
  else if (glslVersion == GLSL_VERSION_330) {
    __s = 
    "#version 330 core\nin vec4 v_color;\nin vec4 v_color1;\nlayout(location = 0, index = 0) out vec4 o_color;\nlayout(location = 0, index = 1) out vec4 o_color1;\nvoid main()\n{\n\to_color  = v_color;\n\to_color1 = v_color1;\n}\n"
    ;
  }
  else if (glslVersion == GLSL_VERSION_300_ES) {
    __s = 
    "#version 300 es\nin mediump vec4 v_color;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main()\n{\n\to_color = v_color;\n}\n"
    ;
  }
  else {
    __s = (char *)0x0;
  }
  pSVar4 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = this->m_context;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,__s_00,&local_141);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,__s,&local_142);
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_100._193_8_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  memset(&local_100,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources,&local_120);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources + 1,&local_140);
  glu::ShaderProgram::ShaderProgram(pSVar4,renderCtx,&local_100);
  this->m_program = pSVar4;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_100.attribLocationBindings);
  lVar5 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_100.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar5));
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  pSVar4 = this->m_program;
  if ((pSVar4->m_program).m_info.linkOk == false) {
    if (pSVar4 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(pSVar4);
      operator_delete(pSVar4,0xd0);
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Failed to compile program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsFragmentOpUtil.cpp"
               ,0x9c);
  }
  else {
    iVar2 = (**(code **)(lVar3 + 0x780))((pSVar4->m_program).m_program,"a_position");
    this->m_positionLoc = iVar2;
    iVar2 = (**(code **)(lVar3 + 0x780))((this->m_program->m_program).m_program,"a_color");
    this->m_colorLoc = iVar2;
    if (this->m_blendFuncExt == true) {
      iVar2 = (**(code **)(lVar3 + 0x780))((this->m_program->m_program).m_program,"a_color1");
      this->m_color1Loc = iVar2;
    }
    if (((-1 < this->m_positionLoc) && (-1 < this->m_colorLoc)) &&
       ((this->m_blendFuncExt != true || (-1 < this->m_color1Loc)))) {
      return;
    }
    pSVar4 = this->m_program;
    if (pSVar4 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(pSVar4);
      operator_delete(pSVar4,0xd0);
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid attribute locations",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsFragmentOpUtil.cpp"
               ,0xa8);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

QuadRenderer::QuadRenderer (const glu::RenderContext& context, glu::GLSLVersion glslVersion)
	: m_context			(context)
	, m_program			(DE_NULL)
	, m_positionLoc		(0)
	, m_colorLoc		(-1)
	, m_color1Loc		(-1)
	, m_blendFuncExt	(!glu::glslVersionIsES(glslVersion) && (glslVersion >= glu::GLSL_VERSION_330))
{
	DE_ASSERT(glslVersion == glu::GLSL_VERSION_100_ES ||
			  glslVersion == glu::GLSL_VERSION_300_ES ||
			  glslVersion == glu::GLSL_VERSION_330);

	const glw::Functions&	gl		= context.getFunctions();
	const char*				vertSrc	= getVertSrc(glslVersion);
	const char*				fragSrc	= getFragSrc(glslVersion);

	m_program = new glu::ShaderProgram(m_context, glu::makeVtxFragSources(vertSrc, fragSrc));
	if (!m_program->isOk())
	{
		delete m_program;
		throw tcu::TestError("Failed to compile program", DE_NULL, __FILE__, __LINE__);
	}

	m_positionLoc	= gl.getAttribLocation(m_program->getProgram(), "a_position");
	m_colorLoc		= gl.getAttribLocation(m_program->getProgram(), "a_color");

	if (m_blendFuncExt)
		m_color1Loc = gl.getAttribLocation(m_program->getProgram(), "a_color1");

	if (m_positionLoc < 0 || m_colorLoc < 0 || (m_blendFuncExt && m_color1Loc < 0))
	{
		delete m_program;
		throw tcu::TestError("Invalid attribute locations", DE_NULL, __FILE__, __LINE__);
	}
}